

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall
DReachabilityPropagator::explain_dominator(DReachabilityPropagator *this,int u,int dom,vec<Lit> *ps)

{
  bool bVar1;
  int iVar2;
  size_type __n;
  DReachabilityPropagator *in_RDI;
  vector<bool,_std::allocator<bool>_> v;
  vector<bool,_std::allocator<bool>_> red;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  GraphPropagator *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff38;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  vector<bool,_std::allocator<bool>_> *this_00;
  allocator_type local_8a;
  undefined1 local_89;
  int in_stack_ffffffffffffff7c;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  DReachabilityPropagator *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffb8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  DReachabilityPropagator *in_stack_ffffffffffffffd0;
  
  vec<Lit>::push((vec<Lit> *)in_stack_ffffffffffffff30);
  get_root_idx(in_RDI);
  GraphPropagator::getNodeVar(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  BoolView::getValLit((BoolView *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (Lit *)in_stack_ffffffffffffff38);
  GraphPropagator::getNodeVar(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  bVar1 = BoolView::isFixed((BoolView *)0x2b120c);
  if (bVar1) {
    GraphPropagator::getNodeVar(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    bVar1 = BoolView::isTrue((BoolView *)in_stack_ffffffffffffff30);
    if (bVar1) {
      GraphPropagator::getNodeVar(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      BoolView::getValLit((BoolView *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
      ;
      vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (Lit *)in_stack_ffffffffffffff38);
    }
  }
  iVar2 = GraphPropagator::nbNodes((GraphPropagator *)0x2b127a);
  __n = (size_type)iVar2;
  uVar3 = 0;
  this_00 = (vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffffb6;
  std::allocator<bool>::allocator((allocator<bool> *)0x2b129b);
  std::vector<bool,_std::allocator<bool>_>::vector
            (this_00,__n,(bool *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  std::allocator<bool>::~allocator((allocator<bool> *)0x2b12c9);
  reverseDFS(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c);
  iVar2 = GraphPropagator::nbNodes((GraphPropagator *)0x2b12f5);
  local_89 = 0;
  __a = &local_8a;
  std::allocator<bool>::allocator((allocator<bool> *)0x2b131a);
  std::vector<bool,_std::allocator<bool>_>::vector
            (this_00,__n,(bool *)CONCAT44(iVar2,in_stack_ffffffffffffff40),__a);
  std::allocator<bool>::~allocator((allocator<bool> *)0x2b133f);
  reverseDFStoBorder(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,(vec<Lit> *)CONCAT17(uVar3,in_stack_ffffffffffffffb0)
                     ,in_stack_ffffffffffffffac);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2b1379)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x2b1386)
  ;
  return;
}

Assistant:

void DReachabilityPropagator::explain_dominator(int u, int dom, vec<Lit>& ps) {
	if (DEBUG) {
		std::cout << "Explain dominators " << getNodeVar(get_root_idx()).isFixed()
							<< getNodeVar(u).isFixed() << '\n';
	}
	ps.push();
	ps.push(getNodeVar(get_root_idx()).getValLit());
	if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
		ps.push(getNodeVar(u).getValLit());
	}
	std::vector<bool> red(nbNodes(), false);
	reverseDFS(u, red, dom);
	std::vector<bool> v(nbNodes(), false);
	reverseDFStoBorder(u, v, red, ps, dom);
	if (DEBUG) {
		std::cout << "Size expl for dominator " << ps.size() << '\n';
	}
}